

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void analogies(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args)

{
  size_type sVar1;
  invalid_argument *this;
  const_reference pvVar2;
  ostream *this_00;
  ostream *this_01;
  FastText *in_RDI;
  string wordC;
  string wordB;
  string wordA;
  string prompt;
  string model;
  FastText fasttext;
  int32_t k;
  size_t *in_stack_fffffffffffffe68;
  string *in_stack_fffffffffffffe70;
  allocator *paVar3;
  undefined8 in_stack_fffffffffffffe88;
  FastText *in_stack_fffffffffffffea0;
  string local_150 [32];
  string local_130 [32];
  string local_110 [39];
  allocator local_e9;
  string local_e8 [32];
  string local_c8 [160];
  string *in_stack_ffffffffffffffd8;
  string *in_stack_ffffffffffffffe0;
  string *in_stack_ffffffffffffffe8;
  int k_00;
  FastText *this_02;
  
  this_02 = in_RDI;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_RDI);
  if (sVar1 == 3) {
    k_00 = 10;
  }
  else {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_RDI);
    if (sVar1 != 4) {
      printAnalogiesUsage();
      exit(1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_RDI,3);
    k_00 = std::__cxx11::stoi(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,0);
  }
  if (k_00 < 1) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"k needs to be 1 or higher!");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  ::fasttext::FastText::FastText(in_stack_fffffffffffffea0);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_RDI,2);
  std::__cxx11::string::string(local_c8,(string *)pvVar2);
  this_00 = std::operator<<((ostream *)&std::cout,"Loading model ");
  this_01 = std::operator<<(this_00,local_c8);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  ::fasttext::FastText::loadModel
            ((FastText *)
             fasttext.dict_.super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(string *)
                    fasttext.args_.super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi);
  paVar3 = &local_e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"Query triplet (A - B + C)? ",paVar3);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::__cxx11::string::string(local_110);
  std::__cxx11::string::string(local_130);
  std::__cxx11::string::string(local_150);
  std::operator<<((ostream *)&std::cout,local_e8);
  do {
    std::operator>>((istream *)&std::cin,local_110);
    std::operator>>((istream *)&std::cin,local_130);
    std::operator>>((istream *)&std::cin,local_150);
    ::fasttext::FastText::getAnalogies
              (this_02,k_00,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
               in_stack_ffffffffffffffd8);
    printPredictions((vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)in_RDI,SUB81((ulong)in_stack_fffffffffffffe88 >> 0x38,0),
                     SUB81((ulong)in_stack_fffffffffffffe88 >> 0x30,0));
    std::
    vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)this_00);
    std::operator<<((ostream *)&std::cout,local_e8);
  } while( true );
}

Assistant:

void analogies(const std::vector<std::string> args) {
  int32_t k;
  if (args.size() == 3) {
    k = 10;
  } else if (args.size() == 4) {
    k = std::stoi(args[3]);
  } else {
    printAnalogiesUsage();
    exit(EXIT_FAILURE);
  }
  if (k <= 0) {
    throw std::invalid_argument("k needs to be 1 or higher!");
  }
  FastText fasttext;
  std::string model(args[2]);
  std::cout << "Loading model " << model << std::endl;
  fasttext.loadModel(model);

  std::string prompt("Query triplet (A - B + C)? ");
  std::string wordA, wordB, wordC;
  std::cout << prompt;
  while (true) {
    std::cin >> wordA;
    std::cin >> wordB;
    std::cin >> wordC;
    printPredictions(fasttext.getAnalogies(k, wordA, wordB, wordC), true, true);

    std::cout << prompt;
  }
  exit(0);
}